

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

void __thiscall
r_exec::_Mem::pack_fact_object
          (_Mem *this,Code *fact_object,Code *hlp,uint16_t *write_index,
          vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *references)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ushort uVar4;
  ulong uVar5;
  ushort uVar6;
  Atom p_atom;
  undefined4 local_54;
  ushort *local_50;
  long local_48;
  uint local_3c;
  vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *local_38;
  undefined4 extraout_var_00;
  
  local_3c = (uint)*write_index;
  uVar4 = 0;
  local_50 = write_index;
  local_38 = (vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)references;
  do {
    iVar2 = (*(fact_object->super__Object)._vptr__Object[6])(fact_object);
    if ((ushort)iVar2 <= uVar4) {
      return;
    }
    iVar2 = (*(fact_object->super__Object)._vptr__Object[4])(fact_object,(ulong)uVar4);
    local_54 = *(undefined4 *)CONCAT44(extraout_var,iVar2);
    cVar1 = r_code::Atom::getDescriptor();
    uVar6 = (ushort)(Atom *)&local_48;
    if (cVar1 == -0x7c) {
      r_code::Atom::asIndex();
      r_code::Atom::IPointer(uVar6);
      iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar2),(Atom *)&local_48);
LAB_001990fc:
      r_code::Atom::~Atom((Atom *)&local_48);
    }
    else if (cVar1 == -0x7b) {
      r_code::Atom::asIndex();
      iVar2 = (*(fact_object->super__Object)._vptr__Object[9])(fact_object);
      lVar3 = CONCAT44(extraout_var_00,iVar2);
      for (uVar5 = 0; uVar5 = uVar5 & 0xffff,
          uVar5 < (ulong)((long)*(pointer *)(local_38 + 8) - *(long *)local_38 >> 3);
          uVar5 = (ulong)((int)uVar5 + 1)) {
        if (*(long *)(*(long *)local_38 + uVar5 * 8) == lVar3) {
          r_code::Atom::RPointer(uVar6);
          iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar2),(Atom *)&local_48);
          goto LAB_001990fc;
        }
      }
      r_code::Atom::RPointer(uVar6);
      iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar2),(Atom *)&local_48);
      r_code::Atom::~Atom((Atom *)&local_48);
      if (lVar3 != 0) {
        LOCK();
        *(long *)(lVar3 + 8) = *(long *)(lVar3 + 8) + 1;
        UNLOCK();
      }
      local_48 = lVar3;
      std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
      emplace_back<core::P<r_code::Code>>(local_38,(P<r_code::Code> *)&local_48);
      core::P<r_code::Code>::~P((P<r_code::Code> *)&local_48);
    }
    else {
      iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar2),(Atom *)&local_54);
    }
    *local_50 = *local_50 + 1;
    r_code::Atom::~Atom((Atom *)&local_54);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void _Mem::pack_fact_object(Code *fact_object, Code *hlp, uint16_t &write_index, std::vector<P<Code> > *references) const
{
    uint16_t offset = write_index;

    for (uint16_t i = 0; i < fact_object->code_size(); ++i) {
        Atom p_atom = fact_object->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::R_PTR: { // append this reference to the hlp's if not already there.
            Code *reference = fact_object->get_reference(p_atom.asIndex());
            bool found = false;

            for (uint16_t i = 0; i < references->size(); ++i) {
                if ((*references)[i] == reference) {
                    hlp->code(write_index) = Atom::RPointer(i);
                    found = true;
                    break;
                }
            }

            if (!found) {
                hlp->code(write_index) = Atom::RPointer(references->size());
                references->push_back(reference);
            }

            ++write_index;
            break;
        }

        case Atom::I_PTR: // offset the ptr by write_index. PB HERE.
            hlp->code(write_index) = Atom::IPointer(offset + p_atom.asIndex());
            ++write_index;
            break;

        default:
            hlp->code(write_index) = p_atom;
            ++write_index;
            break;
        }
    }
}